

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_cell_tuv(REF_GEOM ref_geom,REF_INT node,REF_INT *nodes,REF_INT type,REF_DBL *param,
                 REF_INT *sens)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  REF_DBL local_1e0;
  REF_DBL local_1d8;
  double local_1d0;
  REF_DBL local_1c0;
  REF_DBL local_1b8;
  double local_1b0;
  double local_1a0;
  double local_198;
  double local_190;
  double local_180;
  double local_178;
  double local_170;
  REF_INT local_15c;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rsb;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_INT hits;
  REF_DBL dist1;
  REF_DBL dist0;
  REF_DBL t;
  REF_DBL from_param [2];
  double uvtmax [2];
  double uvtmin [2];
  double uv1 [2];
  double uv0 [2];
  double uv [2];
  double trange [2];
  uint local_60;
  uint local_5c;
  REF_INT cell_node;
  REF_INT node_index;
  REF_INT from_geom;
  REF_INT from;
  REF_INT geom;
  REF_INT edgeid;
  REF_INT id;
  REF_INT node_per;
  REF_INT *sens_local;
  REF_DBL *param_local;
  REF_INT *pRStack_28;
  REF_INT type_local;
  REF_INT *nodes_local;
  REF_GEOM pRStack_18;
  REF_INT node_local;
  REF_GEOM ref_geom_local;
  
  _id = sens;
  sens_local = (REF_INT *)param;
  param_local._4_4_ = type;
  pRStack_28 = nodes;
  nodes_local._4_4_ = node;
  pRStack_18 = ref_geom;
  if ((type < 1) || (2 < type)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2fc,
           "ref_geom_cell_tuv","type not allowed");
    ref_geom_local._4_4_ = 1;
  }
  else {
    edgeid = type + 1;
    geom = nodes[edgeid];
    local_5c = 0xffffffff;
    for (local_60 = 0; (int)local_60 < edgeid; local_60 = local_60 + 1) {
      if (node == nodes[(int)local_60]) {
        if ((long)(int)local_5c != -1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x302,"ref_geom_cell_tuv","node found twice in nodes",0xffffffffffffffff,
                 (long)(int)local_5c);
          return 1;
        }
        local_5c = local_60;
      }
    }
    if (local_5c == 0xffffffff) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x306,
             "ref_geom_cell_tuv","node not found in nodes");
      ref_geom_local._4_4_ = 1;
    }
    else {
      uVar1 = ref_geom_find(ref_geom,node,type,geom,&from_geom);
      if (uVar1 == 0) {
        if ((pRStack_18->descr[from_geom * 6 + 3] == 0) &&
           (pRStack_18->descr[from_geom * 6 + 4] == 0)) {
          if (0 < (int)param_local._4_4_) {
            *(REF_DBL *)sens_local = pRStack_18->param[from_geom << 1];
          }
          if (1 < (int)param_local._4_4_) {
            *(REF_DBL *)(sens_local + 2) = pRStack_18->param[from_geom * 2 + 1];
          }
          *_id = 0;
          ref_geom_local._4_4_ = 0;
        }
        else {
          if (param_local._4_4_ == 1) {
            uVar1 = ref_egads_edge_trange(pRStack_18,geom,uv + 1);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x317,"ref_geom_cell_tuv",(ulong)uVar1,"trange");
              return uVar1;
            }
            node_index = pRStack_28[(int)(1 - local_5c)];
            uVar1 = ref_geom_tuv(pRStack_18,node_index,param_local._4_4_,geom,&t);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x319,"ref_geom_cell_tuv",(ulong)uVar1,"from tuv");
              return uVar1;
            }
            dVar2 = t - uv[1];
            dVar3 = trange[0] - t;
            if ((dVar2 < 0.0) || (dVar3 < 0.0)) {
              printf(" from t = %e %e %e, dist = %e %e\n",uv[1],t,trange[0],dVar2,dVar3);
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,799,"ref_geom_cell_tuv","from node not in trange");
              return 1;
            }
            if (dVar3 <= dVar2) {
              *_id = -1;
              *(double *)sens_local = trange[0];
            }
            else {
              *_id = 1;
              *(double *)sens_local = uv[1];
            }
          }
          else {
            if (param_local._4_4_ != 2) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x379,"ref_geom_cell_tuv",6,"can\'t to geom type yet");
              return 6;
            }
            if (pRStack_18->descr[from_geom * 6 + 4] == 0) {
              node_index = -1;
              for (local_60 = 0; (int)local_60 < edgeid; local_60 = local_60 + 1) {
                uVar1 = ref_geom_find(pRStack_18,pRStack_28[(int)local_60],param_local._4_4_,geom,
                                      &cell_node);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0x32e,"ref_geom_cell_tuv",(ulong)uVar1,"not found");
                  return uVar1;
                }
                if (((local_5c != local_60) && (pRStack_18->descr[cell_node * 6 + 3] == 0)) &&
                   (pRStack_18->descr[cell_node * 6 + 4] == 0)) {
                  node_index = pRStack_28[(int)local_60];
                }
              }
              if (node_index == -1) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x33a,"ref_geom_cell_tuv","can\'t find from tuv in tri cell");
                ref_geom_tattle(pRStack_18,*pRStack_28);
                ref_geom_tattle(pRStack_18,pRStack_28[1]);
                ref_geom_tattle(pRStack_18,pRStack_28[2]);
                printf("faceid %d node %d node_index %d\n",(ulong)(uint)geom,
                       (ulong)nodes_local._4_4_,(ulong)local_5c);
                return 1;
              }
              from = pRStack_18->descr[from_geom * 6 + 3];
              uVar1 = ref_geom_tuv(pRStack_18,node_index,2,geom,uv0 + 1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x33c,"ref_geom_cell_tuv",(ulong)uVar1,"from uv");
                return uVar1;
              }
              uVar1 = ref_geom_tuv(pRStack_18,nodes_local._4_4_,1,from,&dist0);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x33d,"ref_geom_cell_tuv",(ulong)uVar1,"edge t0");
                return uVar1;
              }
              uVar1 = ref_egads_edge_face_uv(pRStack_18,from,geom,1,dist0,uv1 + 1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x33e,"ref_geom_cell_tuv",(ulong)uVar1,"uv 1");
                return uVar1;
              }
              uVar1 = ref_egads_edge_face_uv(pRStack_18,from,geom,-1,dist0,uvtmin + 1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x33f,"ref_geom_cell_tuv",(ulong)uVar1,"uv -1");
                return uVar1;
              }
              dVar2 = pow(uv1[1] - uv0[1],2.0);
              dVar3 = pow(uv0[0] - uv[0],2.0);
              dVar2 = sqrt(dVar2 + dVar3);
              dVar3 = pow(uvtmin[1] - uv0[1],2.0);
              dVar4 = pow(uv1[0] - uv[0],2.0);
              dVar3 = sqrt(dVar3 + dVar4);
              if (dVar3 <= dVar2) {
                *_id = -1;
                *(double *)sens_local = uvtmin[1];
                *(double *)(sens_local + 2) = uv1[0];
              }
              else {
                *_id = 1;
                *(double *)sens_local = uv1[1];
                *(double *)(sens_local + 2) = uv0[0];
              }
            }
            else {
              uv1[1] = 0.0;
              uv0[0] = 0.0;
              ref_private_status_reis_ai._4_4_ = 0;
              for (local_60 = 0; (int)local_60 < edgeid; local_60 = local_60 + 1) {
                uVar1 = ref_geom_find(pRStack_18,pRStack_28[(int)local_60],param_local._4_4_,geom,
                                      &cell_node);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0x351,"ref_geom_cell_tuv",(ulong)uVar1,"not found");
                  return uVar1;
                }
                if ((pRStack_18->descr[cell_node * 6 + 3] == 0) &&
                   (pRStack_18->descr[cell_node * 6 + 4] == 0)) {
                  uVar1 = ref_geom_tuv(pRStack_18,pRStack_28[(int)local_60],2,geom,uv0 + 1);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                           ,0x355,"ref_geom_cell_tuv",(ulong)uVar1,"from uv");
                    return uVar1;
                  }
                  uv1[1] = uv0[1] + uv1[1];
                  uv0[0] = uv[0] + uv0[0];
                  ref_private_status_reis_ai._4_4_ = ref_private_status_reis_ai._4_4_ + 1;
                }
              }
              if (ref_private_status_reis_ai._4_4_ < 1) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x35b,"ref_geom_cell_tuv","no seed uv found for DEGEN");
                return 1;
              }
              uv1[1] = uv1[1] / (double)ref_private_status_reis_ai._4_4_;
              uv0[0] = uv0[0] / (double)ref_private_status_reis_ai._4_4_;
              *_id = 0;
              if (pRStack_18->descr[from_geom * 6 + 4] < 1) {
                local_15c = -pRStack_18->descr[from_geom * 6 + 4];
              }
              else {
                local_15c = pRStack_18->descr[from_geom * 6 + 4];
              }
              from = local_15c;
              uVar1 = ref_egads_edge_trange(pRStack_18,local_15c,uv + 1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x361,"ref_geom_cell_tuv",(ulong)uVar1,"trange");
                return uVar1;
              }
              uVar1 = ref_egads_edge_face_uv
                                (pRStack_18,from,pRStack_18->descr[from_geom * 6 + 1],*_id,uv[1],
                                 uvtmax + 1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x365,"ref_geom_cell_tuv",(ulong)uVar1,"uv t min");
                return uVar1;
              }
              uVar1 = ref_egads_edge_face_uv
                                (pRStack_18,from,pRStack_18->descr[from_geom * 6 + 1],*_id,trange[0]
                                 ,from_param + 1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x369,"ref_geom_cell_tuv",(ulong)uVar1,"uv t max");
                return uVar1;
              }
              if (pRStack_18->descr[from_geom * 6 + 4] < 1) {
                *(double *)sens_local = uv1[1];
                if (from_param[1] <= uvtmax[1]) {
                  local_1b0 = from_param[1];
                }
                else {
                  local_1b0 = uvtmax[1];
                }
                if (*(double *)sens_local <= local_1b0) {
                  if (from_param[1] <= uvtmax[1]) {
                    local_1c0 = from_param[1];
                  }
                  else {
                    local_1c0 = uvtmax[1];
                  }
                  local_1b8 = local_1c0;
                }
                else {
                  local_1b8 = *(REF_DBL *)sens_local;
                }
                *(REF_DBL *)sens_local = local_1b8;
                if (uvtmax[1] <= from_param[1]) {
                  local_1d0 = from_param[1];
                }
                else {
                  local_1d0 = uvtmax[1];
                }
                if (local_1d0 <= *(double *)sens_local) {
                  if (uvtmax[1] <= from_param[1]) {
                    local_1e0 = from_param[1];
                  }
                  else {
                    local_1e0 = uvtmax[1];
                  }
                  local_1d8 = local_1e0;
                }
                else {
                  local_1d8 = *(REF_DBL *)sens_local;
                }
                *(REF_DBL *)sens_local = local_1d8;
                *(REF_DBL *)(sens_local + 2) = pRStack_18->param[from_geom * 2 + 1];
              }
              else {
                *(REF_DBL *)sens_local = pRStack_18->param[from_geom << 1];
                *(double *)(sens_local + 2) = uv0[0];
                if (uvtmax[0] <= uvtmin[0]) {
                  local_170 = uvtmax[0];
                }
                else {
                  local_170 = uvtmin[0];
                }
                if (*(double *)(sens_local + 2) <= local_170) {
                  if (uvtmax[0] <= uvtmin[0]) {
                    local_180 = uvtmax[0];
                  }
                  else {
                    local_180 = uvtmin[0];
                  }
                  local_178 = local_180;
                }
                else {
                  local_178 = *(double *)(sens_local + 2);
                }
                *(double *)(sens_local + 2) = local_178;
                if (uvtmin[0] <= uvtmax[0]) {
                  local_190 = uvtmax[0];
                }
                else {
                  local_190 = uvtmin[0];
                }
                if (local_190 <= *(double *)(sens_local + 2)) {
                  if (uvtmin[0] <= uvtmax[0]) {
                    local_1a0 = uvtmax[0];
                  }
                  else {
                    local_1a0 = uvtmin[0];
                  }
                  local_198 = local_1a0;
                }
                else {
                  local_198 = *(double *)(sens_local + 2);
                }
                *(double *)(sens_local + 2) = local_198;
              }
            }
          }
          ref_geom_local._4_4_ = 0;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x30b,"ref_geom_cell_tuv",(ulong)uVar1,"not found");
        printf(" %d type %d id\n",(ulong)param_local._4_4_,(ulong)(uint)geom);
        ref_geom_tattle(pRStack_18,nodes_local._4_4_);
        ref_geom_local._4_4_ = uVar1;
      }
    }
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_cell_tuv(REF_GEOM ref_geom, REF_INT node,
                                     REF_INT *nodes, REF_INT type,
                                     REF_DBL *param, REF_INT *sens) {
  REF_INT node_per;
  REF_INT id, edgeid, geom, from, from_geom;
  REF_INT node_index, cell_node;
  double trange[2], uv[2], uv0[2], uv1[2], uvtmin[2], uvtmax[2];
  REF_DBL from_param[2], t;
  REF_DBL dist0, dist1;
  REF_INT hits;

  RAS(1 <= type && type <= 2, "type not allowed");
  node_per = type + 1;
  id = nodes[node_per];
  node_index = REF_EMPTY;
  for (cell_node = 0; cell_node < node_per; cell_node++) {
    if (node == nodes[cell_node]) {
      REIS(REF_EMPTY, node_index, "node found twice in nodes");
      node_index = cell_node;
    }
  }
  RAS(REF_EMPTY != node_index, "node not found in nodes");

  RSB(ref_geom_find(ref_geom, node, type, id, &geom), "not found", {
    printf(" %d type %d id\n", type, id);
    ref_geom_tattle(ref_geom, node);
  });

  if (0 == ref_geom_jump(ref_geom, geom) &&
      0 == ref_geom_degen(ref_geom, geom)) {
    if (type > 0) param[0] = ref_geom_param(ref_geom, 0, geom);
    if (type > 1) param[1] = ref_geom_param(ref_geom, 1, geom);
    *sens = 0;
    return REF_SUCCESS;
  }

  switch (type) {
    case REF_GEOM_EDGE:
      RSS(ref_egads_edge_trange(ref_geom, id, trange), "trange");
      from = nodes[1 - node_index];
      RSS(ref_geom_tuv(ref_geom, from, type, id, from_param), "from tuv");
      dist0 = from_param[0] - trange[0];
      dist1 = trange[1] - from_param[0];
      if (dist0 < 0.0 || dist1 < 0.0) {
        printf(" from t = %e %e %e, dist = %e %e\n", trange[0], from_param[0],
               trange[1], dist0, dist1);
        THROW("from node not in trange");
      }
      if (dist0 < dist1) {
        *sens = 1;
        param[0] = trange[0];
      } else {
        *sens = -1;
        param[0] = trange[1];
      }
      break;
    case REF_GEOM_FACE:
      if (0 == ref_geom_degen(ref_geom, geom)) {
        from = REF_EMPTY;
        for (cell_node = 0; cell_node < node_per; cell_node++) {
          RSS(ref_geom_find(ref_geom, nodes[cell_node], type, id, &from_geom),
              "not found");
          if (node_index != cell_node &&
              0 == ref_geom_jump(ref_geom, from_geom) &&
              0 == ref_geom_degen(ref_geom, from_geom)) {
            from = nodes[cell_node];
          }
        }
        RAB(REF_EMPTY != from, "can't find from tuv in tri cell", {
          ref_geom_tattle(ref_geom, nodes[0]);
          ref_geom_tattle(ref_geom, nodes[1]);
          ref_geom_tattle(ref_geom, nodes[2]);
          printf("faceid %d node %d node_index %d\n", id, node, node_index);
        });
        edgeid = ref_geom_jump(ref_geom, geom);
        RSS(ref_geom_tuv(ref_geom, from, REF_GEOM_FACE, id, uv), "from uv");
        RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_EDGE, edgeid, &t), "edge t0");
        RSS(ref_egads_edge_face_uv(ref_geom, edgeid, id, 1, t, uv0), "uv 1");
        RSS(ref_egads_edge_face_uv(ref_geom, edgeid, id, -1, t, uv1), "uv -1");
        dist0 = sqrt(pow(uv0[0] - uv[0], 2) + pow(uv0[1] - uv[1], 2));
        dist1 = sqrt(pow(uv1[0] - uv[0], 2) + pow(uv1[1] - uv[1], 2));
        if (dist0 < dist1) {
          *sens = 1;
          param[0] = uv0[0];
          param[1] = uv0[1];
        } else {
          *sens = -1;
          param[0] = uv1[0];
          param[1] = uv1[1];
        }
      } else {
        uv0[0] = 0.0;
        uv0[1] = 0.0;
        hits = 0;
        for (cell_node = 0; cell_node < node_per; cell_node++) {
          RSS(ref_geom_find(ref_geom, nodes[cell_node], type, id, &from_geom),
              "not found");
          if (0 == ref_geom_jump(ref_geom, from_geom) &&
              0 == ref_geom_degen(ref_geom, from_geom)) {
            RSS(ref_geom_tuv(ref_geom, nodes[cell_node], REF_GEOM_FACE, id, uv),
                "from uv");
            uv0[0] += uv[0];
            uv0[1] += uv[1];
            hits++;
          }
        }
        RAS(0 < hits, "no seed uv found for DEGEN");
        uv0[0] /= (REF_DBL)hits;
        uv0[1] /= (REF_DBL)hits;

        *sens = 0;
        edgeid = ABS(ref_geom_degen(ref_geom, geom));
        RSS(ref_egads_edge_trange(ref_geom, edgeid, trange), "trange");
        RSS(ref_egads_edge_face_uv(ref_geom, edgeid,
                                   ref_geom_id(ref_geom, geom), *sens,
                                   trange[0], uvtmin),
            "uv t min");
        RSS(ref_egads_edge_face_uv(ref_geom, edgeid,
                                   ref_geom_id(ref_geom, geom), *sens,
                                   trange[1], uvtmax),
            "uv t max");
        /* edgeid sign convention defined in ref_geom_mark_jump_degen */
        if (0 < ref_geom_degen(ref_geom, geom)) {
          param[0] = ref_geom_param(ref_geom, 0, geom);
          param[1] = uv0[1];
          param[1] = MAX(param[1], MIN(uvtmin[1], uvtmax[1]));
          param[1] = MIN(param[1], MAX(uvtmin[1], uvtmax[1]));
        } else {
          param[0] = uv0[0];
          param[0] = MAX(param[0], MIN(uvtmin[0], uvtmax[0]));
          param[0] = MIN(param[0], MAX(uvtmin[0], uvtmax[0]));
          param[1] = ref_geom_param(ref_geom, 1, geom);
        }
      }
      break;
    default:
      RSS(REF_IMPLEMENT, "can't to geom type yet");
  }

  return REF_SUCCESS;
}